

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_timeout.cxx
# Opt level: O2

void __thiscall nuraft::raft_server::check_srv_to_leave_timeout(raft_server *this)

{
  element_type *peVar1;
  element_type *peVar2;
  int iVar3;
  uint64_t uVar4;
  long lVar5;
  _Alloc_hider local_40;
  
  peVar1 = (this->srv_to_leave_).super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
  ;
  if (peVar1 != (element_type *)0x0) {
    uVar4 = timer_helper::get_us(&peVar1->last_resp_timer_);
    lVar5 = (long)DAT_001c3534;
    context::get_params((context *)&stack0xffffffffffffffc0);
    iVar3 = *(int *)&((element_type *)(local_40._M_p + 8))->_vptr_state_mgr;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffc8);
    if ((ulong)(iVar3 * lVar5) < uVar4 / 1000) {
      peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (peVar2 != (element_type *)0x0) {
        iVar3 = (*peVar2->_vptr_logger[7])();
        if (2 < iVar3) {
          peVar2 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          msg_if_given_abi_cxx11_
                    ((string *)&stack0xffffffffffffffc0,
                     "server to be removed %d, response timeout %lu ms. force remove now",
                     (ulong)(uint)((((this->srv_to_leave_).
                                     super___shared_ptr<nuraft::peer,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->config_).
                                   super___shared_ptr<nuraft::srv_config,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_ptr)->id_,uVar4 / 1000);
          (*peVar2->_vptr_logger[8])
                    (peVar2,3,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_timeout.cxx"
                     ,"check_srv_to_leave_timeout",0x33,(string *)&stack0xffffffffffffffc0);
          std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
        }
      }
      remove_peer_from_peers(this,&this->srv_to_leave_);
      reset_srv_to_leave(this);
    }
  }
  return;
}

Assistant:

void raft_server::check_srv_to_leave_timeout() {
    if (!srv_to_leave_) return;
    ulong last_resp_ms = srv_to_leave_->get_resp_timer_us() / 1000;
    if ( last_resp_ms >
             (ulong)raft_server::raft_limits_.leave_limit_ *
             ctx_->get_params()->heart_beat_interval_ ) {
        // Timeout: remove peer.
        p_wn("server to be removed %d, response timeout %" PRIu64 " ms. "
             "force remove now",
             srv_to_leave_->get_id(),
             last_resp_ms);
        remove_peer_from_peers(srv_to_leave_);
        reset_srv_to_leave();
    }
}